

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O1

size_t phosg::skip_word(string *s,size_t offset)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  
  uVar1 = s->_M_string_length;
  sVar2 = offset;
  if (offset < uVar1) {
    do {
      uVar3 = (ulong)(byte)(s->_M_dataplus)._M_p[offset];
      if ((uVar3 < 0x21) && (sVar2 = offset, (0x100002600U >> (uVar3 & 0x3f) & 1) != 0)) break;
      offset = offset + 1;
      sVar2 = uVar1;
    } while (uVar1 != offset);
  }
  uVar3 = sVar2;
  if (sVar2 < uVar1) {
    do {
      uVar3 = (ulong)(byte)(s->_M_dataplus)._M_p[sVar2];
      if (0x20 < uVar3) {
        return sVar2;
      }
      if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) {
        return sVar2;
      }
      sVar2 = sVar2 + 1;
      uVar3 = uVar1;
    } while (uVar1 != sVar2);
  }
  return uVar3;
}

Assistant:

size_t skip_word(const string& s, size_t offset) {
  return skip_whitespace(s, skip_non_whitespace(s, offset));
}